

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

bool __thiscall
btCollisionWorldImporter::convertAllObjects
          (btCollisionWorldImporter *this,btBulletSerializedArrays *arrays)

{
  char *pcVar1;
  double dVar2;
  double dVar3;
  anon_union_8_2_511b660c_for_btHashPtr_0 aVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  btCollisionShape **ppbVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  btCollisionShape *shape;
  char *newname;
  btOptimizedBvh *bvh;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_98;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_90;
  btHashMap<btHashPtr,_btCollisionShape_*> *local_88;
  btHashMap<btHashPtr,_btCollisionObject_*> *local_80;
  btHashMap<btHashString,_btCollisionShape_*> *local_78;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_70 [8];
  
  local_88 = &this->m_shapeMap;
  btHashMap<btHashPtr,_btCollisionShape_*>::clear(local_88);
  local_80 = &this->m_bodyMap;
  btHashMap<btHashPtr,_btCollisionObject_*>::clear(local_80);
  for (lVar6 = 0; lVar6 < *(int *)(arrays + 4); lVar6 = lVar6 + 1) {
    local_70[0]._0_4_ = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
    local_70[0].m_hashValues[1] = extraout_var;
    (**(code **)(*local_70[0].m_pointer + 0x30))
              (local_70[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x10) + lVar6 * 8));
    local_98 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x10) + lVar6 * 8);
    btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
              (&this->m_bvhMap,(btHashPtr *)&local_98,(btOptimizedBvh **)&local_70[0].m_pointer);
  }
  for (lVar6 = 0; lVar6 < *(int *)(arrays + 0x24); lVar6 = lVar6 + 1) {
    local_70[0]._0_4_ = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
    local_70[0].m_hashValues[1] = extraout_var_00;
    (**(code **)(*local_70[0].m_pointer + 0x28))
              (local_70[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x30) + lVar6 * 8));
    local_98 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x30) + lVar6 * 8);
    btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
              (&this->m_bvhMap,(btHashPtr *)&local_98,(btOptimizedBvh **)&local_70[0].m_pointer);
  }
  local_78 = &this->m_nameShapeMap;
  for (lVar6 = 0; lVar6 < *(int *)(arrays + 0x44); lVar6 = lVar6 + 1) {
    aVar4 = (anon_union_8_2_511b660c_for_btHashPtr_0)
            ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x50) + lVar6 * 8))->
            m_pointer;
    local_98.m_pointer = convertCollisionShape(this,(btCollisionShapeData *)aVar4.m_pointer);
    if ((btCollisionShape *)local_98.m_pointer != (btCollisionShape *)0x0) {
      local_70[0] = aVar4;
      btHashMap<btHashPtr,_btCollisionShape_*>::insert
                (local_88,(btHashPtr *)local_70,(btCollisionShape **)&local_98.m_pointer);
      if (((btCollisionShape *)local_98.m_pointer != (btCollisionShape *)0x0) &&
         (*aVar4.m_pointer != (char *)0x0)) {
        local_90.m_pointer = duplicateName(this,*aVar4.m_pointer);
        local_70[0].m_pointer = local_98.m_pointer;
        btHashMap<btHashPtr,_const_char_*>::insert
                  (&this->m_objectNameMap,(btHashPtr *)local_70,(char **)&local_90.m_pointer);
        btHashString::btHashString((btHashString *)local_70,(char *)local_90.m_pointer);
        btHashMap<btHashString,_btCollisionShape_*>::insert
                  (local_78,(btHashString *)local_70,(btCollisionShape **)&local_98.m_pointer);
      }
    }
  }
  for (lVar6 = 0; lVar6 < *(int *)(arrays + 0xe4); lVar6 = lVar6 + 1) {
    aVar4 = (anon_union_8_2_511b660c_for_btHashPtr_0)
            ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0xf0) + lVar6 * 8))->
            m_pointer;
    local_70[0] = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)((long)aVar4.m_pointer + 8);
    ppbVar5 = btHashMap<btHashPtr,_btCollisionShape_*>::find(local_88,(btHashPtr *)local_70);
    if ((ppbVar5 == (btCollisionShape **)0x0) || (*ppbVar5 == (btCollisionShape *)0x0)) {
      puts("error: no shape found");
    }
    else {
      pcVar1 = (char *)((long)aVar4.m_pointer + 0x98);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      btTransform::deSerializeDouble
                ((btTransform *)local_70,(btTransformDoubleData *)((long)aVar4.m_pointer + 0x20));
      local_98._0_4_ =
           (*this->_vptr_btCollisionWorldImporter[3])
                     (this,local_70,*ppbVar5,*(undefined8 *)((long)aVar4.m_pointer + 0x18));
      local_98.m_hashValues[1] = extraout_var_01;
      dVar2 = *(double *)((long)aVar4.m_pointer + 400);
      dVar3 = *(double *)((long)aVar4.m_pointer + 0x1a0);
      *(int *)((long)local_98.m_pointer + 0x148) = *(int *)((long)local_98.m_pointer + 0x148) + 2;
      *(ulong *)((long)local_98.m_pointer + 0xf4) = CONCAT44((float)dVar3,(float)dVar2);
      local_90 = aVar4;
      btHashMap<btHashPtr,_btCollisionObject_*>::insert
                (local_80,(btHashPtr *)&local_90,(btCollisionObject **)&local_98.m_pointer);
    }
  }
  for (lVar6 = 0; lVar6 < *(int *)(arrays + 0x104); lVar6 = lVar6 + 1) {
    aVar4 = (anon_union_8_2_511b660c_for_btHashPtr_0)
            ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x110) + lVar6 * 8))->
            m_pointer;
    local_70[0] = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)((long)aVar4.m_pointer + 8);
    ppbVar5 = btHashMap<btHashPtr,_btCollisionShape_*>::find(local_88,(btHashPtr *)local_70);
    if ((ppbVar5 == (btCollisionShape **)0x0) || (*ppbVar5 == (btCollisionShape *)0x0)) {
      puts("error: no shape found");
    }
    else {
      pcVar1 = (char *)((long)aVar4.m_pointer + 0x5c);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      btTransform::deSerializeFloat
                ((btTransform *)local_70,(btTransformFloatData *)((long)aVar4.m_pointer + 0x20));
      local_98._0_4_ =
           (*this->_vptr_btCollisionWorldImporter[3])
                     (this,local_70,*ppbVar5,*(undefined8 *)((long)aVar4.m_pointer + 0x18));
      local_98.m_hashValues[1] = extraout_var_02;
      local_90 = aVar4;
      btHashMap<btHashPtr,_btCollisionObject_*>::insert
                (local_80,(btHashPtr *)&local_90,(btCollisionObject **)&local_98.m_pointer);
    }
  }
  return true;
}

Assistant:

bool	btCollisionWorldImporter::convertAllObjects( btBulletSerializedArrays* arrays)
{

	m_shapeMap.clear();
	m_bodyMap.clear();

	int i;

	for (i=0;i<arrays->m_bvhsDouble.size();i++)
	{
		btOptimizedBvh* bvh = createOptimizedBvh();
		btQuantizedBvhDoubleData* bvhData = arrays->m_bvhsDouble[i];
		bvh->deSerializeDouble(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsDouble[i],bvh);
	}
	for (i=0;i<arrays->m_bvhsFloat.size();i++)
    {
        btOptimizedBvh* bvh = createOptimizedBvh();
   		btQuantizedBvhFloatData* bvhData = arrays->m_bvhsFloat[i];
		bvh->deSerializeFloat(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsFloat[i],bvh);
	}





	for (i=0;i<arrays->m_colShapeData.size();i++)
	{
		btCollisionShapeData* shapeData = arrays->m_colShapeData[i];
		btCollisionShape* shape = convertCollisionShape(shapeData);
		if (shape)
		{
	//		printf("shapeMap.insert(%x,%x)\n",shapeData,shape);
			m_shapeMap.insert(shapeData,shape);
		}

		if (shape&& shapeData->m_name)
		{
			char* newname = duplicateName(shapeData->m_name);
			m_objectNameMap.insert(shape,newname);
			m_nameShapeMap.insert(newname,shape);
		}
	}


	for (i=0;i<arrays->m_collisionObjectDataDouble.size();i++)
	{
        btCollisionObjectDoubleData* colObjData = arrays->m_collisionObjectDataDouble[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeDouble(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);
            body->setFriction(btScalar(colObjData->m_friction));
            body->setRestitution(btScalar(colObjData->m_restitution));

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
	}
	for (i=0;i<arrays->m_collisionObjectDataFloat.size();i++)
	{
        btCollisionObjectFloatData* colObjData = arrays->m_collisionObjectDataFloat[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeFloat(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
    }

	return true;
}